

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O2

void __thiscall
Protocol::MQTT::V5::Payload<(Protocol::MQTT::Common::ControlPacketType)1>::dump
          (Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this,FastString *out,int indent)

{
  undefined4 in_register_00000014;
  uint indent_00;
  String local_30;
  
  MQTTStringPrintf((char *)&local_30,"%*sCONNECT payload\n",CONCAT44(in_register_00000014,indent),""
                  );
  Bstrlib::String::operator+=(out,&local_30);
  Bstrlib::String::~String(&local_30);
  indent_00 = indent + 2;
  MQTTStringPrintf((char *)&local_30,"%*sClientID: ",(ulong)indent_00,"");
  Bstrlib::String::operator+=(out,&local_30);
  Bstrlib::String::~String(&local_30);
  Common::DynamicString::dump(&this->clientID,out,0);
  if (((this->fixedHeader->super_ConnectHeaderImpl).field_2.flags & 4) != 0) {
    WillMessage::dump(this->willMessage,out,indent_00);
  }
  MQTTStringPrintf((char *)&local_30,"%*sUsername: ",(ulong)indent_00,"");
  Bstrlib::String::operator+=(out,&local_30);
  Bstrlib::String::~String(&local_30);
  Common::DynamicString::dump(&this->username,out,0);
  MQTTStringPrintf((char *)&local_30,"%*sPassword: ",(ulong)indent_00,"");
  Bstrlib::String::operator+=(out,&local_30);
  Bstrlib::String::~String(&local_30);
  Common::DynamicBinaryData::dump(&this->password,out,0);
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sCONNECT payload\n", (int)indent, "");
                    out += MQTTStringPrintf("%*sClientID: ", (int)indent + 2, ""); clientID.dump(out, 0);
                    if (fixedHeader->willFlag) willMessage->dump(out, indent + 2);  // Not testing pointer here, since it's a correctly constructed object is expected
                    out += MQTTStringPrintf("%*sUsername: ", (int)indent + 2, ""); username.dump(out, 0);
                    out += MQTTStringPrintf("%*sPassword: ", (int)indent + 2, ""); password.dump(out, 0);
                }